

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugstream.cpp
# Opt level: O0

void __thiscall MetaSim::DebugStream::enter(DebugStream *this,string *s)

{
  bool bVar1;
  Simulation *pSVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  bool in_stack_0000000f;
  vector<bool,_std::allocator<bool>_> *in_stack_00000010;
  iterator i;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  bool bVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffffc0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffffc8;
  
  std::vector<bool,_std::allocator<bool>_>::push_back(in_stack_00000010,in_stack_0000000f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin(in_RSI);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end(in_RSI);
  std::
  find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end(in_RSI);
  bVar1 = __gnu_cxx::operator==
                    (in_RDI,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_RSI);
  bVar3 = true;
  if (!bVar1) {
    pSVar2 = Simulation::getInstance();
    Simulation::getTime(pSVar2);
    bVar1 = operator<((Tick *)&stack0xffffffffffffffc8,(Tick *)(in_RDI + 10));
    bVar3 = true;
    if (!bVar1) {
      pSVar2 = Simulation::getInstance();
      Simulation::getTime(pSVar2);
      bVar3 = operator>((Tick *)&stack0xffffffffffffffc0,(Tick *)(in_RDI + 0xb));
    }
  }
  if (bVar3 == false) {
    *(undefined1 *)((long)&in_RDI[1]._M_current + 1) = 1;
  }
  else {
    *(undefined1 *)((long)&in_RDI[1]._M_current + 1) = 0;
  }
  *(undefined1 *)((long)&in_RDI[1]._M_current + 3) = 1;
  return;
}

Assistant:

void DebugStream::enter(std::string s) 
    {
        _dbgStack.push_back(_isDebug);
        std::vector<std::string>::iterator i = 
            find(_dbgLevels.begin(), _dbgLevels.end(), s);
        if (i == _dbgLevels.end()
            || (SIMUL.getTime() < _t1) 
            || (SIMUL.getTime() > _t2)) 
            _isDebug = false;
        else
            _isDebug = true;
        _isIndenting = true;
    }